

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  int iVar1;
  mbedtls_mpi *pmVar2;
  ulong uVar3;
  mbedtls_mpi_uint *pmVar4;
  mbedtls_mpi_uint mVar5;
  
  iVar1 = mbedtls_mpi_grow(X,Y->n);
  if (iVar1 == 0) {
    pmVar2 = Y;
    if (assign == '\0') {
      pmVar2 = X;
    }
    X->s = pmVar2->s;
    for (uVar3 = 0; uVar3 < Y->n; uVar3 = uVar3 + 1) {
      pmVar4 = Y->p + uVar3;
      if (assign == '\0') {
        pmVar4 = X->p + uVar3;
      }
      X->p[uVar3] = *pmVar4;
    }
    for (; uVar3 < X->n; uVar3 = uVar3 + 1) {
      if (assign == '\0') {
        mVar5 = X->p[uVar3];
      }
      else {
        mVar5 = 0;
      }
      X->p[uVar3] = mVar5;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_safe_cond_assign( mbedtls_mpi *X, const mbedtls_mpi *Y, unsigned char assign )
{
    int ret = 0;
    size_t i;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    /* make sure assign is 0 or 1 in a time-constant manner */
    assign = (assign | (unsigned char)-assign) >> 7;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, Y->n ) );

    X->s = X->s * ( 1 - assign ) + Y->s * assign;

    for( i = 0; i < Y->n; i++ )
        X->p[i] = X->p[i] * ( 1 - assign ) + Y->p[i] * assign;

    for( ; i < X->n; i++ )
        X->p[i] *= ( 1 - assign );

cleanup:
    return( ret );
}